

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O1

int32 read_kd_trees(char *infile,kd_tree_node_t ***out_trees,uint32 *out_n_trees)

{
  int iVar1;
  int32 iVar2;
  FILE *__stream;
  kd_tree_node_t **ppkVar3;
  kd_tree_node_t *node;
  int32 optional;
  uint uVar4;
  ulong uVar5;
  int version;
  uint32 m;
  char line [256];
  uint local_140;
  uint local_13c;
  long local_138;
  char local_130;
  
  __stream = fopen(infile,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                   ,0x1d8,"Failed to open %s",infile);
  }
  else {
    iVar1 = __isoc99_fscanf(__stream,"%255s",&local_138);
    if ((iVar1 == 1) && (local_130 == '\0' && local_138 == 0x53454552542d444b)) {
      iVar1 = __isoc99_fscanf(__stream,"%255s %d",&local_138);
      if (((iVar1 == 2) && (local_138 == 0x6e6f6973726576)) && ((int)local_140 < 2)) {
        iVar2 = read_tree_int((FILE *)__stream,"n_trees",out_n_trees,0);
        if (iVar2 < 0) {
          return -1;
        }
        ppkVar3 = (kd_tree_node_t **)
                  __ckd_calloc__((ulong)*out_n_trees,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                 ,0x1e8);
        *out_trees = ppkVar3;
        if (*out_n_trees != 0) {
          uVar5 = 0;
          do {
            iVar2 = read_tree_int((FILE *)__stream,"TREE",&local_13c,0);
            uVar4 = 5;
            if (-1 < iVar2) {
              if (uVar5 == local_13c) {
                node = (kd_tree_node_t *)
                       __ckd_calloc__(1,0x58,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                      ,499);
                (*out_trees)[uVar5] = node;
                iVar2 = read_tree_int((FILE *)__stream,"n_density",&node->n_density,0);
                if ((-1 < iVar2) &&
                   (iVar2 = read_tree_int((FILE *)__stream,"n_comp",&node->n_comp,0), -1 < iVar2)) {
                  optional = 0;
                  iVar2 = read_tree_int((FILE *)__stream,"n_level",&node->n_level,0);
                  if (-1 < iVar2) {
                    iVar2 = read_tree_float((FILE *)__stream,"threshold",&node->threshold,optional);
                    uVar4 = 5;
                    if (-1 < iVar2) {
                      iVar2 = read_kd_nodes((FILE *)__stream,node,node->n_level);
                      uVar4 = iVar2 >> 0x1f & 5;
                    }
                    goto LAB_0010e388;
                  }
                }
              }
              else {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                        ,0x1ef,"Tree number %u out of sequence\n");
              }
              uVar4 = 5;
            }
LAB_0010e388:
            if (uVar4 != 0) {
              if (uVar4 != 5) {
                return -1;
              }
              fclose(__stream);
              if (*out_n_trees != 0) {
                uVar5 = 0;
                do {
                  free_kd_tree((*out_trees)[uVar5]);
                  (*out_trees)[uVar5] = (kd_tree_node_t *)0x0;
                  uVar5 = uVar5 + 1;
                } while (uVar5 < *out_n_trees);
              }
              ckd_free(*out_trees);
              *out_trees = (kd_tree_node_t **)0x0;
              return -1;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < *out_n_trees);
        }
        fclose(__stream);
        return 0;
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
              ,0x1e2,"Unsupported kd-tree file format %s %d\n",&local_138,(ulong)local_140);
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
              ,0x1dd,"Doesn\'t appear to be a kd-tree file: %s\n");
    }
  }
  return -1;
}

Assistant:

int32
read_kd_trees(const char *infile, kd_tree_node_t ***out_trees, uint32 *out_n_trees)
{
	FILE *fp;
	char line[256];
	int n, version;
	uint32 i, m;

	if ((fp = fopen(infile, "r"))  == NULL) {
		E_ERROR_SYSTEM("Failed to open %s", infile);
		return -1;
	}
	n = fscanf(fp, "%255s", line);
	if (n != 1 || strcmp(line, "KD-TREES")) {
		E_ERROR("Doesn't appear to be a kd-tree file: %s\n");
		return -1;
	}
	n = fscanf(fp, "%255s %d", line, &version);
	if (n != 2 || strcmp(line, "version") || version > KDTREE_VERSION) {
		E_ERROR("Unsupported kd-tree file format %s %d\n", line, version);
		return -1;
	}
	if (read_tree_int(fp, "n_trees", out_n_trees, FALSE) < 0)
		return -1;

	*out_trees = ckd_calloc(*out_n_trees, sizeof(kd_tree_node_t **));
	for (i = 0; i < *out_n_trees; ++i) {
		kd_tree_node_t *tree;

		if (read_tree_int(fp, "TREE", &m, FALSE) < 0)
			goto error_out;
		if (m != i) {
			E_ERROR("Tree number %u out of sequence\n", m);
			goto error_out;
		}

		(*out_trees)[i] = tree = ckd_calloc(1, sizeof(*tree));
		if (read_tree_int(fp, "n_density", &tree->n_density, FALSE) < 0)
			goto error_out;
		if (read_tree_int(fp, "n_comp", &tree->n_comp, FALSE) < 0)
			goto error_out;
		if (read_tree_int(fp, "n_level", &tree->n_level, FALSE) < 0)
			goto error_out;
		if (read_tree_float(fp, "threshold", &tree->threshold, FALSE) < 0)
			goto error_out;
		if (read_kd_nodes(fp, tree, tree->n_level) < 0)
			goto error_out;
	}
	fclose(fp);
	return 0;

error_out:
	fclose(fp);
	for (i = 0; i < *out_n_trees; ++i) {
		free_kd_tree((*out_trees)[i]);
		(*out_trees)[i] = NULL;
	}
	ckd_free(*out_trees);
	*out_trees = NULL;
	return -1;
}